

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::RemoveFromIndexes
          (RowGroupCollection *this,TableIndexList *indexes,Vector *row_identifiers,idx_t count)

{
  data_ptr_t pdVar1;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *puVar2;
  idx_t iVar3;
  ulong uVar4;
  pthread_mutex_t *ppVar5;
  RowGroupCollection *this_00;
  pointer pSVar6;
  int iVar7;
  type pIVar8;
  reference pvVar9;
  Allocator *pAVar10;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *this_01;
  RowGroupSegmentTree *this_02;
  RowGroup *this_03;
  reference pvVar11;
  reference other;
  BoundIndex *this_04;
  MissingExtensionException *this_05;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DataTableInfo *this_06;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *puVar12;
  ulong uVar13;
  __node_base *p_Var14;
  size_type __n;
  idx_t iVar15;
  StorageIndex *col;
  __node_base *p_Var16;
  pointer pSVar17;
  ulong uVar18;
  reference rVar19;
  allocator local_441;
  pthread_mutex_t *local_440;
  RowGroupCollection *local_438;
  vector<duckdb::LogicalType,_true> *local_430;
  vector<duckdb::StorageIndex,_true> column_ids;
  SelectionVector sel;
  vector<duckdb::LogicalType,_true> column_types;
  DataChunk result_chunk;
  DataChunk fetch_chunk;
  vector<bool,_true> fetched_columns;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_308;
  LogicalType local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  Value local_2b8;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  indexed_column_id_set;
  TableScanState state;
  
  pdVar1 = row_identifiers->data;
  indexed_column_id_set._M_h._M_buckets = &indexed_column_id_set._M_h._M_single_bucket;
  indexed_column_id_set._M_h._M_bucket_count = 1;
  indexed_column_id_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  indexed_column_id_set._M_h._M_element_count = 0;
  indexed_column_id_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  indexed_column_id_set._M_h._M_rehash_policy._M_next_resize = 0;
  indexed_column_id_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_438 = this;
  ::std::mutex::lock(&indexes->indexes_lock);
  p_Var14 = &indexed_column_id_set._M_h._M_before_begin;
  puVar2 = (indexes->indexes).
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_440 = (pthread_mutex_t *)indexes;
  for (puVar12 = (indexes->indexes).
                 super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar2; puVar12 = puVar12 + 1
      ) {
    pIVar8 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*(puVar12)
    ;
    ::std::__detail::
    _Insert_base<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::insert<std::__detail::_Node_const_iterator<unsigned_long,true,false>>
              ((_Insert_base<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&indexed_column_id_set,
               (_Node_const_iterator<unsigned_long,_true,_false>)
               (pIVar8->column_id_set)._M_h._M_before_begin._M_nxt,
               (_Node_const_iterator<unsigned_long,_true,_false>)0x0);
  }
  pthread_mutex_unlock(local_440);
  column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var16 = p_Var14;
  while (p_Var16 = p_Var16->_M_nxt, p_Var16 != (__node_base *)0x0) {
    ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
    emplace_back<unsigned_long_const&>
              ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&column_ids,
               (unsigned_long *)(p_Var16 + 1));
  }
  ::std::
  __sort<__gnu_cxx::__normal_iterator<duckdb::StorageIndex*,std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
             super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl
             .super__Vector_impl_data._M_start,
             column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
             super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl
             .super__Vector_impl_data._M_finish);
  pSVar6 = column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
           super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_430 = &local_438->types;
  for (pSVar17 = column_ids.
                 super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                 _M_impl.super__Vector_impl_data._M_start; pSVar17 != pSVar6; pSVar17 = pSVar17 + 1)
  {
    pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(local_430,pSVar17->index);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
               ,pvVar9);
  }
  TableScanState::TableScanState(&state);
  local_308.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start =
       column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
       super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_308.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish =
       column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
       super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_308.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
       super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TableScanState::Initialize
            (&state,(vector<duckdb::StorageIndex,_true> *)&local_308,
             (optional_ptr<duckdb::ClientContext,_true>)0x0,
             (optional_ptr<duckdb::TableFilterSet,_true>)0x0,
             (optional_ptr<duckdb::SampleOptions,_true>)0x0);
  this_00 = local_438;
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_308);
  state.table_state.max_row =
       (this_00->total_rows).super___atomic_base<unsigned_long>._M_i + this_00->row_start;
  DataChunk::DataChunk(&fetch_chunk);
  pAVar10 = GetAllocator(this_00);
  DataChunk::Initialize(&fetch_chunk,pAVar10,&column_types,0x800);
  DataChunk::DataChunk(&result_chunk);
  local_2b8.type_.id_ = INVALID;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&fetched_columns,
             ((long)(this_00->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this_00->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18,(bool *)&local_2b8,
             (allocator_type *)&local_2d8);
  pAVar10 = GetAllocator(this_00);
  DataChunk::Initialize(&result_chunk,pAVar10,local_430,&fetched_columns,0x800);
  while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
    rVar19 = vector<bool,_true>::get<true>(&fetched_columns,(size_type)p_Var14[1]._M_nxt);
    *rVar19._M_p = *rVar19._M_p | rVar19._M_mask;
  }
  SelectionVector::SelectionVector(&sel,0x800);
  this_01 = &local_438->row_groups;
  uVar13 = 0;
  do {
    if (count <= uVar13) {
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)&fetched_columns);
      DataChunk::~DataChunk(&result_chunk);
      DataChunk::~DataChunk(&fetch_chunk);
      TableScanState::~TableScanState(&state);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&column_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
                (&column_ids.
                  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&indexed_column_id_set._M_h);
      return;
    }
    DataChunk::Reset(&fetch_chunk);
    DataChunk::Reset(&result_chunk);
    iVar15 = *(idx_t *)(pdVar1 + uVar13 * 8);
    this_02 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_01);
    this_03 = SegmentTree<duckdb::RowGroup,_true>::GetSegment
                        (&this_02->super_SegmentTree<duckdb::RowGroup,_true>,iVar15);
    iVar3 = (this_03->super_SegmentBase<duckdb::RowGroup>).start;
    CollectionScanState::Initialize(&state.table_state,local_430);
    uVar18 = iVar15 - iVar3;
    RowGroup::InitializeScanWithOffset(this_03,&state.table_state,uVar18 >> 0xb);
    RowGroup::ScanCommitted(this_03,&state.table_state,&fetch_chunk,TABLE_SCAN_COMMITTED_ROWS);
    DataChunk::Verify(&fetch_chunk);
    uVar18 = (uVar18 & 0xfffffffffffff800) + iVar3;
    iVar15 = 0;
    while( true ) {
      if (((count <= uVar13 + iVar15) ||
          (uVar4 = *(ulong *)(pdVar1 + iVar15 * 8 + uVar13 * 8), uVar4 < uVar18)) ||
         (fetch_chunk.count + uVar18 <= uVar4)) break;
      sel.sel_vector[iVar15] = (int)uVar4 - (int)uVar18;
      iVar15 = iVar15 + 1;
    }
    __n = 0;
    for (uVar18 = 0;
        uVar18 < (ulong)(((long)(local_438->types).
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_438->types).
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar18 = uVar18 + 1) {
      rVar19 = vector<bool,_true>::get<true>(&fetched_columns,uVar18);
      if ((*rVar19._M_p & rVar19._M_mask) == 0) {
        pvVar11 = vector<duckdb::Vector,_true>::get<true>(&result_chunk.data,uVar18);
        pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(local_430,uVar18);
        LogicalType::LogicalType(&local_2f0,pvVar9);
        Value::Value(&local_2b8,&local_2f0);
        Vector::Reference(pvVar11,&local_2b8);
        Value::~Value(&local_2b8);
        LogicalType::~LogicalType(&local_2f0);
      }
      else {
        pvVar11 = vector<duckdb::Vector,_true>::get<true>(&result_chunk.data,uVar18);
        other = vector<duckdb::Vector,_true>::get<true>(&fetch_chunk.data,__n);
        Vector::Reference(pvVar11,other);
        __n = __n + 1;
      }
    }
    result_chunk.count = fetch_chunk.count;
    DataChunk::Slice(&result_chunk,&sel,iVar15);
    ppVar5 = local_440;
    ::std::mutex::lock((mutex *)&local_440->__data);
    puVar2 = *(unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> **)
              ((long)ppVar5 + 0x30);
    for (puVar12 = (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
                   ppVar5[1].__align; puVar12 != puVar2; puVar12 = puVar12 + 1) {
      this_04 = (BoundIndex *)
                unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                          (puVar12);
      iVar7 = (*(this_04->super_Index)._vptr_Index[2])(this_04);
      if ((char)iVar7 == '\0') {
        this_05 = (MissingExtensionException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_2b8,
                   "Cannot delete from index \'%s\', unknown index type \'%s\'. You need to load the extension that provides this index type before table \'%s\' can be modified."
                   ,&local_441);
        iVar7 = (*(this_04->super_Index)._vptr_Index[4])(this_04);
        ::std::__cxx11::string::string((string *)&local_2d8,(string *)CONCAT44(extraout_var,iVar7));
        iVar7 = (*(this_04->super_Index)._vptr_Index[3])(this_04);
        ::std::__cxx11::string::string
                  ((string *)&local_258,(string *)CONCAT44(extraout_var_00,iVar7));
        this_06 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&local_438->info);
        DataTableInfo::GetTableName_abi_cxx11_(&local_278,this_06);
        MissingExtensionException::
        MissingExtensionException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (this_05,(string *)&local_2b8,&local_2d8,&local_258,&local_278);
        __cxa_throw(this_05,&MissingExtensionException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
      BoundIndex::Delete(this_04,&result_chunk,row_identifiers);
    }
    pthread_mutex_unlock(local_440);
    uVar13 = uVar13 + iVar15;
  } while( true );
}

Assistant:

void RowGroupCollection::RemoveFromIndexes(TableIndexList &indexes, Vector &row_identifiers, idx_t count) {
	auto row_ids = FlatVector::GetData<row_t>(row_identifiers);

	// Collect all indexed columns.
	unordered_set<column_t> indexed_column_id_set;
	indexes.Scan([&](Index &index) {
		D_ASSERT(index.IsBound());
		auto &set = index.GetColumnIdSet();
		indexed_column_id_set.insert(set.begin(), set.end());
		return false;
	});
	vector<StorageIndex> column_ids;
	for (auto &col : indexed_column_id_set) {
		column_ids.emplace_back(col);
	}
	sort(column_ids.begin(), column_ids.end());

	vector<LogicalType> column_types;
	for (auto &col : column_ids) {
		column_types.push_back(types[col.GetPrimaryIndex()]);
	}

	// Initialize the fetch state. Only use indexed columns.
	TableScanState state;
	state.Initialize(std::move(column_ids));
	state.table_state.max_row = row_start + total_rows;

	// Used for scanning data. Only contains the indexed columns.
	DataChunk fetch_chunk;
	fetch_chunk.Initialize(GetAllocator(), column_types);

	// Used for index value removal.
	// Contains all columns but only initializes indexed ones.
	DataChunk result_chunk;
	auto fetched_columns = vector<bool>(types.size(), false);
	result_chunk.Initialize(GetAllocator(), types, fetched_columns);

	// Now set all to-be-fetched columns.
	for (auto &col : indexed_column_id_set) {
		fetched_columns[col] = true;
	}

	// Iterate over the row ids.
	SelectionVector sel(STANDARD_VECTOR_SIZE);
	for (idx_t r = 0; r < count;) {
		fetch_chunk.Reset();
		result_chunk.Reset();

		// Figure out which row_group to fetch from.
		auto row_id = row_ids[r];
		auto row_group = row_groups->GetSegment(UnsafeNumericCast<idx_t>(row_id));
		auto row_group_vector_idx = (UnsafeNumericCast<idx_t>(row_id) - row_group->start) / STANDARD_VECTOR_SIZE;
		auto base_row_id = row_group_vector_idx * STANDARD_VECTOR_SIZE + row_group->start;

		// Fetch the current vector into fetch_chunk.
		state.table_state.Initialize(GetTypes());
		row_group->InitializeScanWithOffset(state.table_state, row_group_vector_idx);
		row_group->ScanCommitted(state.table_state, fetch_chunk, TableScanType::TABLE_SCAN_COMMITTED_ROWS);
		fetch_chunk.Verify();

		// Check for any remaining row ids, if they also fall into this vector.
		// We try to fetch as many rows as possible at the same time.
		idx_t sel_count = 0;
		for (; r < count; r++) {
			idx_t current_row = idx_t(row_ids[r]);
			if (current_row < base_row_id || current_row >= base_row_id + fetch_chunk.size()) {
				// This row id does not fall into the current chunk.
				break;
			}
			auto row_in_vector = current_row - base_row_id;
			D_ASSERT(row_in_vector < fetch_chunk.size());
			sel.set_index(sel_count++, row_in_vector);
		}
		D_ASSERT(sel_count > 0);

		// Reference the necessary columns of the fetch_chunk.
		idx_t fetch_idx = 0;
		for (idx_t j = 0; j < types.size(); j++) {
			if (fetched_columns[j]) {
				result_chunk.data[j].Reference(fetch_chunk.data[fetch_idx++]);
				continue;
			}
			result_chunk.data[j].Reference(Value(types[j]));
		}
		result_chunk.SetCardinality(fetch_chunk);

		// Slice the vector with all rows that are present in this vector.
		// Then, erase all values from the indexes.
		result_chunk.Slice(sel, sel_count);
		indexes.Scan([&](Index &index) {
			if (index.IsBound()) {
				index.Cast<BoundIndex>().Delete(result_chunk, row_identifiers);
				return false;
			}
			throw MissingExtensionException(
			    "Cannot delete from index '%s', unknown index type '%s'. You need to load the "
			    "extension that provides this index type before table '%s' can be modified.",
			    index.GetIndexName(), index.GetIndexType(), info->GetTableName());
		});
	}
}